

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  int iVar1;
  int iVar2;
  metacall_log_custom_type custom_log;
  
  iVar1 = metacall_log(5);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = metacall_initialize();
    if (iVar1 == 0) {
      metacall_destroy();
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int main(int, char *[])
{
	static const char context[] = "custom log";

	struct metacall_log_custom_type custom_log = {
		(void *)context,
		&format_size,
		&format_serialize,
		&format_deserialize,
		&stream_write,
		&stream_flush
	};

	if (metacall_log(METACALL_LOG_CUSTOM, (void *)&custom_log) != 0)
	{
		return 1;
	}

	if (metacall_initialize() != 0)
	{
		return 1;
	}

	/* Here you can load some scripts */

	metacall_destroy();

	return 0;
}